

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  int iVar1;
  SrcList *pSVar2;
  char *pcVar3;
  sqlite3 *db;
  SrcList *pSrc;
  int iDb;
  TriggerStep *pStep_local;
  Parse *pParse_local;
  
  pSVar2 = sqlite3SrcListAppend(pParse->db,(SrcList *)0x0,&pStep->target,(Token *)0x0);
  if ((pSVar2 != (SrcList *)0x0) &&
     ((iVar1 = sqlite3SchemaToIndex(pParse->db,pStep->pTrig->pSchema), iVar1 == 0 || (1 < iVar1))))
  {
    pcVar3 = sqlite3DbStrDup(pParse->db,pParse->db->aDb[iVar1].zName);
    pSVar2->a[pSVar2->nSrc + -1].zDatabase = pcVar3;
  }
  return pSVar2;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(pParse->db, 0, &pStep->target, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    assert( pSrc->a!=0 );
    iDb = sqlite3SchemaToIndex(pParse->db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      sqlite3 *db = pParse->db;
      assert( iDb<pParse->db->nDb );
      pSrc->a[pSrc->nSrc-1].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    }
  }
  return pSrc;
}